

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O2

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::core::engine::DataManWriter::PopBufferQueue(DataManWriter *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_type *ret;
  long in_RSI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar1;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x690))->__data);
  if (*(__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2> **)
       (in_RSI + 0x670) ==
      *(__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2> **)
       (in_RSI + 0x650)) {
    (this->super_Engine)._vptr_Engine = (_func_int **)0x0;
    (this->super_Engine).m_EngineType._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    std::__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)this,*(__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           **)(in_RSI + 0x650));
    std::
    deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>
    ::pop_front((deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>
                 *)(in_RSI + 0x640));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x690));
  sVar1.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar1.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> DataManWriter::PopBufferQueue()
{
    std::lock_guard<std::mutex> l(m_BufferQueueMutex);
    if (m_BufferQueue.empty())
    {
        return nullptr;
    }
    else
    {
        auto ret = m_BufferQueue.front();
        m_BufferQueue.pop();
        return ret;
    }
}